

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall Array::Array(Array *this,int width,int height)

{
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  this->_width = width;
  this->_height = height;
  uVar5 = 0;
  uVar4 = (ulong)(uint)height << 3;
  if (height < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = (ulong)(uint)height;
  if (height < 1) {
    uVar3 = uVar5;
  }
  ppiVar1 = (int **)operator_new__(uVar4);
  this->_data = ppiVar1;
  uVar4 = (ulong)(uint)width << 2;
  if (width < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    piVar2 = (int *)operator_new__(uVar4);
    this->_data[uVar5] = piVar2;
  }
  return;
}

Assistant:

Array::Array(int width, int height)
	:_width(width)
	,_height(height)
{
	_data = new int*[_height];

	for (int i = 0; i < _height; ++i) {
		_data[i] = new int[_width];
	}
}